

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

BilinearPatchMesh *
pbrt::BilinearPatch::CreateMesh
          (Transform *renderFromObject,bool reverseOrientation,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  initializer_list<int> __l;
  initializer_list<pbrt::Point2<float>_> __l_00;
  initializer_list<pbrt::Normal3<float>_> __l_01;
  initializer_list<int> __l_02;
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  string *psVar4;
  size_type sVar5;
  reference pvVar6;
  PiecewiseConstant2D **ppPVar7;
  ulong uVar8;
  Transform *in_RCX;
  Image *in_RDX;
  byte in_SIL;
  Array2D<float> d;
  Bounds2f domain;
  ImageAndMetadata im;
  PiecewiseConstant2D *imageDist;
  string filename;
  size_t nBlps;
  ColorEncodingHandle *in_stack_00000468;
  string *in_stack_00000470;
  Allocator in_stack_00000478;
  vector<int,_std::allocator<int>_> faceIndices;
  size_t i;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> N;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  vector<int,_std::allocator<int>_> vertexIndices;
  char *in_stack_fffffffffffff9c8;
  ImageAndMetadata *in_stack_fffffffffffff9d0;
  ParameterDictionary *in_stack_fffffffffffff9d8;
  BilinearPatchMesh *in_stack_fffffffffffff9e0;
  Array2D<float> *in_stack_fffffffffffff9e8;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_fffffffffffff9f0;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_3;
  allocator<char> *in_stack_fffffffffffffa00;
  int *in_stack_fffffffffffffa08;
  allocator<char> *args_1;
  Transform *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffa18;
  FileLoc *in_stack_fffffffffffffa20;
  Image *name;
  ParameterDictionary *this;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_fffffffffffffa30;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa38;
  PiecewiseConstant2D **in_stack_fffffffffffffa40;
  string *in_stack_fffffffffffffa68;
  Bounds2f *in_stack_fffffffffffffa70;
  Transform *in_stack_fffffffffffffa78;
  Image *this_00;
  Allocator alloc_00;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> local_4b0 [22];
  PiecewiseConstant2D *local_298;
  undefined1 local_289 [40];
  allocator<char> local_261;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  ulong local_200;
  initializer_list<int> local_1f8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined1 local_1d9 [33];
  vector<int,_std::allocator<int>_> local_1b8;
  undefined4 local_19c;
  undefined8 local_198;
  initializer_list<pbrt::Normal3<float>_> local_190;
  allocator<char> local_179;
  string local_178 [32];
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> local_158;
  initializer_list<pbrt::Point2<float>_> local_140;
  uint local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 *local_110;
  undefined8 local_108;
  undefined8 local_f9;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_d8;
  allocator<char> local_b9;
  string local_b8 [32];
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_98;
  allocator<char> local_69;
  string local_68 [32];
  vector<int,_std::allocator<int>_> local_48;
  Transform *local_30;
  Image *local_28;
  byte local_19;
  BilinearPatchMesh *local_8;
  
  local_19 = in_SIL & 1;
  local_30 = in_RCX;
  local_28 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  ParameterDictionary::GetIntArray(in_stack_fffffffffffff9d8,(string *)in_stack_fffffffffffff9d0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  ParameterDictionary::GetPoint3fArray
            (in_stack_fffffffffffff9d8,(string *)in_stack_fffffffffffff9d0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  alloc_00.memoryResource = (memory_resource *)&local_f9;
  this_00 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  ParameterDictionary::GetPoint2fArray
            (in_stack_fffffffffffff9d8,(string *)in_stack_fffffffffffff9d0);
  std::__cxx11::string::~string((string *)((long)&local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar2 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0);
  if (bVar2) {
    sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(&local_98)
    ;
    if (sVar3 != 4) {
      Error((FileLoc *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      local_8 = (BilinearPatchMesh *)0x0;
      local_124 = 1;
      goto LAB_007948d4;
    }
    local_120 = 0;
    local_11c = 1;
    local_118 = 2;
    local_114 = 3;
    local_110 = &local_120;
    local_108 = 4;
    __l._M_len = (size_type)in_stack_fffffffffffff9f0;
    __l._M_array = (iterator)in_stack_fffffffffffff9e8;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0,__l);
  }
  else {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_48);
    if ((sVar3 & 3) != 0) {
      in_stack_fffffffffffffa70 = (Bounds2f *)&local_48;
      in_stack_fffffffffffffa78 = local_30;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa70);
      local_128 = (undefined4)sVar3;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa70);
      local_12c = (uint)sVar3 & 3;
      Error<int,int>(in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18,
                     (int *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      while (sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_48), (sVar3 & 3) != 0) {
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x793f35);
      }
    }
  }
  bVar2 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::empty
                    ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                     in_stack_fffffffffffff9e0);
  if (bVar2) {
    Error((FileLoc *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    local_8 = (BilinearPatchMesh *)0x0;
    local_124 = 1;
  }
  else {
    bVar2 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::empty
                      ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                       in_stack_fffffffffffff9e0);
    if (!bVar2) {
      in_stack_fffffffffffffa68 =
           (string *)
           std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::size(&local_d8);
      psVar4 = (string *)
               std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                         (&local_98);
      if (in_stack_fffffffffffffa68 != psVar4) {
        Error((FileLoc *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
        std::initializer_list<pbrt::Point2<float>_>::initializer_list(&local_140);
        __l_00._M_len = (size_type)in_stack_fffffffffffff9f0;
        __l_00._M_array = (iterator)in_stack_fffffffffffff9e8;
        std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::operator=
                  ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                   in_stack_fffffffffffff9e0,__l_00);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00
              );
    ParameterDictionary::GetNormal3fArray
              (in_stack_fffffffffffff9d8,(string *)in_stack_fffffffffffff9d0);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
    bVar2 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::empty
                      ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                       in_stack_fffffffffffff9e0);
    if (!bVar2) {
      sVar3 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::size
                        (&local_158);
      sVar5 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                        (&local_98);
      if (sVar3 != sVar5) {
        Error((FileLoc *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
        std::initializer_list<pbrt::Normal3<float>_>::initializer_list(&local_190);
        __l_01._M_len = (size_type)in_stack_fffffffffffff9f0;
        __l_01._M_array = (iterator)in_stack_fffffffffffff9e8;
        std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::operator=
                  ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                   in_stack_fffffffffffff9e0,__l_01);
      }
    }
    for (local_198 = 0; uVar1 = local_198,
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_48), (ulong)uVar1 < sVar3;
        local_198 = local_198 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,local_198);
      in_stack_fffffffffffffa40 = (PiecewiseConstant2D **)(long)*pvVar6;
      ppPVar7 = (PiecewiseConstant2D **)
                std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                          (&local_98);
      if (ppPVar7 <= in_stack_fffffffffffffa40) {
        std::vector<int,_std::allocator<int>_>::operator[](&local_48,local_198);
        sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                          (&local_98);
        local_19c = (undefined4)sVar3;
        Error<int&,int>(in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18,
                        (int *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        local_8 = (BilinearPatchMesh *)0x0;
        local_124 = 1;
        goto LAB_007948b6;
      }
    }
    this = (ParameterDictionary *)local_1d9;
    name = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00
              );
    ParameterDictionary::GetIntArray(in_stack_fffffffffffff9d8,(string *)in_stack_fffffffffffff9d0);
    std::__cxx11::string::~string((string *)(local_1d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1d9);
    bVar2 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0);
    if (!bVar2) {
      in_stack_fffffffffffffa18 = (string *)std::vector<int,_std::allocator<int>_>::size(&local_1b8)
      ;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_48);
      if (in_stack_fffffffffffffa18 != (string *)(sVar3 >> 2)) {
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_1b8);
        local_1e0 = (undefined4)sVar3;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_48);
        local_1e4 = (undefined4)(sVar3 >> 2);
        Error<int,int>((FileLoc *)name,(char *)in_stack_fffffffffffffa18,(int *)local_30,
                       in_stack_fffffffffffffa08);
        std::initializer_list<int>::initializer_list(&local_1f8);
        __l_02._M_len = (size_type)in_stack_fffffffffffff9f0;
        __l_02._M_array = (iterator)in_stack_fffffffffffff9e8;
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0,__l_02);
        in_stack_fffffffffffffa10 = local_30;
      }
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_48);
    local_200 = sVar3 >> 2;
    args_1 = &local_261;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa10,(char *)args_1,(allocator<char> *)local_28);
    args_3 = (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)local_289;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa10,(char *)args_1,(allocator<char> *)local_28);
    ParameterDictionary::GetOneString(this,(string *)name,in_stack_fffffffffffffa18);
    ResolveFilename(in_stack_fffffffffffffa68);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string((string *)(local_289 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_289);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator(&local_261);
    local_298 = (PiecewiseConstant2D *)0x0;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      ColorEncodingHandle::TaggedPointer
                ((ColorEncodingHandle *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      Image::Read(in_stack_00000470,in_stack_00000478,in_stack_00000468);
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffff9d0,
                 (float)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 SUB84(in_stack_fffffffffffff9c8,0));
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffff9d0,
                 (float)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 SUB84(in_stack_fffffffffffff9c8,0));
      Bounds2<float>::Bounds2
                ((Bounds2<float> *)in_stack_fffffffffffff9e0,
                 (Point2<float> *)in_stack_fffffffffffff9d8,
                 (Point2<float> *)in_stack_fffffffffffff9d0);
      in_stack_fffffffffffff9f0 = local_4b0;
      std::function<float(pbrt::Point2<float>)>::
      function<pbrt::Image::GetSamplingDistribution(std::function<float(pbrt::Point2<float>)>,pbrt::Bounds2<float>const&,pstd::pmr::polymorphic_allocator<std::byte>)::_default_arg_3_::_lambda(pbrt::Point2<float>)_1_,void>
                ((function<float_(pbrt::Point2<float>)> *)in_stack_fffffffffffff9e0,
                 (anon_class_1_0_00000001 *)in_stack_fffffffffffff9d8);
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffff9d0,
                 (float)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 SUB84(in_stack_fffffffffffff9c8,0));
      Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffff9d0,
                 (float)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                 SUB84(in_stack_fffffffffffff9c8,0));
      Bounds2<float>::Bounds2
                ((Bounds2<float> *)in_stack_fffffffffffff9e0,
                 (Point2<float> *)in_stack_fffffffffffff9d8,
                 (Point2<float> *)in_stack_fffffffffffff9d0);
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff9d0);
      Image::GetSamplingDistribution
                (this_00,(function<float_(pbrt::Point2<float>)> *)in_stack_fffffffffffffa78,
                 in_stack_fffffffffffffa70,alloc_00);
      std::function<float_(pbrt::Point2<float>)>::~function
                ((function<float_(pbrt::Point2<float>)> *)0x794690);
      local_298 = pstd::pmr::polymorphic_allocator<std::byte>::
                  new_object<pbrt::PiecewiseConstant2D,pbrt::Array2D<float>&,pbrt::Bounds2<float>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff9f0,
                             in_stack_fffffffffffff9e8,(Bounds2<float> *)in_stack_fffffffffffff9e0,
                             (polymorphic_allocator<std::byte> *)in_stack_fffffffffffff9d8);
      Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffff9e0);
      ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff9d0);
    }
    in_stack_fffffffffffff9e0 =
         pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::BilinearPatchMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>,pbrt::PiecewiseConstant2D*&>
                   ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffa18,
                    in_stack_fffffffffffffa10,(bool *)args_1,
                    (vector<int,_std::allocator<int>_> *)local_28,args_3,in_stack_fffffffffffff9f0,
                    in_stack_fffffffffffffa30,in_stack_fffffffffffffa38,in_stack_fffffffffffffa40);
    local_124 = 1;
    local_8 = in_stack_fffffffffffff9e0;
    std::__cxx11::string::~string(local_220);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0);
LAB_007948b6:
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~vector
              ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
               in_stack_fffffffffffff9e0);
  }
LAB_007948d4:
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~vector
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffff9e0);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_fffffffffffff9e0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0);
  return local_8;
}

Assistant:

BilinearPatchMesh *BilinearPatch::CreateMesh(const Transform *renderFromObject,
                                             bool reverseOrientation,
                                             const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    std::vector<int> vertexIndices = parameters.GetIntArray("indices");
    std::vector<Point3f> P = parameters.GetPoint3fArray("P");
    std::vector<Point2f> uv = parameters.GetPoint2fArray("uv");

    if (vertexIndices.empty()) {
        if (P.size() == 4)
            // single patch
            vertexIndices = {0, 1, 2, 3};
        else {
            Error(loc, "Vertex indices \"indices\" must be provided with "
                       "bilinear patch mesh shape.");
            return {};
        }
    } else if ((vertexIndices.size() % 4) != 0u) {
        Error(loc,
              "Number of vertex indices %d not a multiple of 4. Discarding %d "
              "excess.",
              int(vertexIndices.size()), int(vertexIndices.size() % 4));
        while ((vertexIndices.size() % 4) != 0u)
            vertexIndices.pop_back();
    }

    if (P.empty()) {
        Error(loc, "Vertex positions \"P\" must be provided with bilinear "
                   "patch mesh shape.");
        return {};
    }

    if (!uv.empty() && uv.size() != P.size()) {
        Error(loc, "Number of \"uv\"s for bilinear patch mesh must match \"P\"s. "
                   "Discarding uvs.");
        uv = {};
    }

    std::vector<Normal3f> N = parameters.GetNormal3fArray("N");
    if (!N.empty() && N.size() != P.size()) {
        Error(loc, "Number of \"N\"s for bilinear patch mesh must match \"P\"s. "
                   "Discarding \"N\"s.");
        N = {};
    }

    for (size_t i = 0; i < vertexIndices.size(); ++i)
        if (vertexIndices[i] >= P.size()) {
            Error(loc,
                  "Bilinear patch mesh has out of-bounds vertex index %d (%d "
                  "\"P\" "
                  "values were given. Discarding this mesh.",
                  vertexIndices[i], (int)P.size());
            return {};
        }

    std::vector<int> faceIndices = parameters.GetIntArray("faceIndices");
    if (!faceIndices.empty() && faceIndices.size() != vertexIndices.size() / 4) {
        Error(loc,
              "Number of face indices %d does not match number of bilinear "
              "patches %d. "
              "Discarding face indices.",
              int(faceIndices.size()), int(vertexIndices.size() / 4));
        faceIndices = {};
    }

    // Grab this before the vertexIndices are std::moved...
    size_t nBlps = vertexIndices.size() / 4;

    std::string filename =
        ResolveFilename(parameters.GetOneString("emissionfilename", ""));
    PiecewiseConstant2D *imageDist = nullptr;
    if (!filename.empty()) {
        ImageAndMetadata im = Image::Read(filename, alloc);
        Bounds2f domain = Bounds2f(Point2f(0, 0), Point2f(1, 1));
        Array2D<Float> d = im.image.GetSamplingDistribution();
        imageDist = alloc.new_object<PiecewiseConstant2D>(d, domain, alloc);
    }

    return alloc.new_object<BilinearPatchMesh>(
        *renderFromObject, reverseOrientation, std::move(vertexIndices), std::move(P),
        std::move(N), std::move(uv), std::move(faceIndices), imageDist);
}